

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O2

libcaption_stauts_t caption_frame_decode(caption_frame_t *frame,uint16_t cc_data,double timestamp)

{
  double dVar1;
  libcaption_stauts_t lVar2;
  ushort uVar3;
  
  if (CONCAT11(eia608_parity_table[(byte)(cc_data >> 8) & 0x7f],eia608_parity_table[cc_data & 0x7f])
      != cc_data) {
    frame->status = LIBCAPTION_ERROR;
    return LIBCAPTION_ERROR;
  }
  if (cc_data == 0x8080) {
    frame->status = LIBCAPTION_OK;
    return LIBCAPTION_OK;
  }
  dVar1 = frame->timestamp;
  if (dVar1 < 0.0) {
LAB_001055b6:
    frame->timestamp = timestamp;
    frame->status = LIBCAPTION_OK;
    lVar2 = LIBCAPTION_OK;
  }
  else if (((dVar1 == timestamp) && (!NAN(dVar1) && !NAN(timestamp))) ||
          (lVar2 = frame->status, lVar2 == LIBCAPTION_READY)) goto LAB_001055b6;
  uVar3 = cc_data & 0x7770;
  if (((uVar3 == 0x1130) || ((cc_data & 0x7670) == 0x1420 || (cc_data & 0x7770) == 0x1720)) &&
     ((frame->state).cc_data == cc_data)) goto LAB_0010560e;
  (frame->state).cc_data = cc_data;
  if (((frame->xds).state == 0) && ((cc_data & 0xf0f) == 0 || (cc_data & 0x7070) != 0)) {
    if ((cc_data & 0x7670) != 0x1420 && (cc_data & 0x7770) != 0x1720) {
      if (((cc_data & 0x1660) == 0x1220 || uVar3 == 0x1130) || (cc_data & 0x6000) != 0) {
        if (frame->write != (caption_frame_buffer_t *)0x0) {
          caption_frame_decode_text(frame,cc_data);
          lVar2 = (frame->write == &frame->front) + LIBCAPTION_OK;
          goto LAB_001056d9;
        }
      }
      else if ((~(uint)cc_data & 0x1040) == 0) {
        caption_frame_decode_preamble(frame,cc_data);
      }
      else {
        if (uVar3 != 0x1120) {
          return lVar2;
        }
        caption_frame_decode_midrowchange(frame,cc_data);
      }
LAB_0010560e:
      frame->status = LIBCAPTION_OK;
      return LIBCAPTION_OK;
    }
    lVar2 = caption_frame_decode_control(frame,cc_data);
  }
  else {
    lVar2 = xds_decode(&frame->xds,cc_data);
  }
LAB_001056d9:
  frame->status = lVar2;
  return lVar2;
}

Assistant:

libcaption_stauts_t caption_frame_decode(caption_frame_t* frame, uint16_t cc_data, double timestamp)
{
    if (!eia608_parity_varify(cc_data)) {
        frame->status = LIBCAPTION_ERROR;
        return frame->status;
    }

    if (eia608_is_padding(cc_data)) {
        frame->status = LIBCAPTION_OK;
        return frame->status;
    }

    if (0 > frame->timestamp || frame->timestamp == timestamp || LIBCAPTION_READY == frame->status) {
        frame->timestamp = timestamp;
        frame->status = LIBCAPTION_OK;
    }

    // skip duplicate controll commands. We also skip duplicate specialna to match the behaviour of iOS/vlc
    if ((eia608_is_specialna(cc_data) || eia608_is_control(cc_data)) && cc_data == frame->state.cc_data) {
        frame->status = LIBCAPTION_OK;
        return frame->status;
    }

    frame->state.cc_data = cc_data;

    if (frame->xds.state) {
        frame->status = xds_decode(&frame->xds, cc_data);
    } else if (eia608_is_xds(cc_data)) {
        frame->status = xds_decode(&frame->xds, cc_data);
    } else if (eia608_is_control(cc_data)) {
        frame->status = caption_frame_decode_control(frame, cc_data);
    } else if (eia608_is_basicna(cc_data) || eia608_is_specialna(cc_data) || eia608_is_westeu(cc_data)) {

        // Don't decode text if we dont know what mode we are in.
        if (!frame->write) {
            frame->status = LIBCAPTION_OK;
            return frame->status;
        }

        frame->status = caption_frame_decode_text(frame, cc_data);

        // If we are in paint on mode, display immiditally
        if (LIBCAPTION_OK == frame->status && caption_frame_painton(frame)) {
            frame->status = LIBCAPTION_READY;
        }
    } else if (eia608_is_preamble(cc_data)) {
        frame->status = caption_frame_decode_preamble(frame, cc_data);
    } else if (eia608_is_midrowchange(cc_data)) {
        frame->status = caption_frame_decode_midrowchange(frame, cc_data);
    }

    return frame->status;
}